

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::join
          (Vector<wasm::analysis::Bool> *this,Element *joinee,Element *joiner)

{
  ulong i_00;
  Element *joinee_00;
  bool bVar1;
  size_type sVar2;
  Element local_31;
  ulong local_30;
  size_t i;
  Element *pEStack_20;
  bool result;
  Element *joiner_local;
  Element *joinee_local;
  Vector<wasm::analysis::Bool> *this_local;
  
  pEStack_20 = joiner;
  joiner_local = joinee;
  joinee_local = (Element *)this;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(joinee);
  if (sVar2 != this->size) {
    __assert_fail("joinee.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x54,
                  "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const Element &) const [L = wasm::analysis::Bool]"
                 );
  }
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(pEStack_20);
  if (sVar2 == this->size) {
    i._7_1_ = false;
    for (local_30 = 0; joinee_00 = joiner_local, i_00 = local_30, local_30 < this->size;
        local_30 = local_30 + 1) {
      local_31 = std::vector<bool,_std::allocator<bool>_>::operator[](pEStack_20,local_30);
      bVar1 = joinAtIndex(this,joinee_00,i_00,&local_31);
      i._7_1_ = (i._7_1_ & 1) != 0 || bVar1;
    }
    return (bool)i._7_1_;
  }
  __assert_fail("joiner.size() == size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                ,0x55,
                "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const Element &) const [L = wasm::analysis::Bool]"
               );
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    assert(joinee.size() == size);
    assert(joiner.size() == size);
    bool result = false;
    for (size_t i = 0; i < size; ++i) {
      result |= joinAtIndex(joinee, i, joiner[i]);
    }
    return result;
  }